

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result.hpp
# Opt level: O0

void __thiscall iutest::TestResult::RecordProperty(TestResult *this,TestProperty *prop)

{
  bool bVar1;
  pointer pTVar2;
  char *str1;
  char *str2;
  __normal_iterator<iutest::TestProperty_*,_std::vector<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>_>
  local_28;
  iterator end;
  iterator it;
  TestProperty *prop_local;
  TestResult *this_local;
  
  end = std::vector<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>::begin
                  (&this->m_test_propertys);
  local_28._M_current =
       (TestProperty *)
       std::vector<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>::end
                 (&this->m_test_propertys);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_28);
    if (!bVar1) {
      std::vector<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>::push_back
                (&this->m_test_propertys,prop);
      return;
    }
    pTVar2 = __gnu_cxx::
             __normal_iterator<iutest::TestProperty_*,_std::vector<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>_>
             ::operator->(&end);
    str1 = TestProperty::key(pTVar2);
    str2 = TestProperty::key(prop);
    bVar1 = detail::IsStringEqual(str1,str2);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<iutest::TestProperty_*,_std::vector<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>_>
    ::operator++(&end);
  }
  pTVar2 = __gnu_cxx::
           __normal_iterator<iutest::TestProperty_*,_std::vector<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>_>
           ::operator->(&end);
  std::__cxx11::string::operator=((string *)&pTVar2->m_value,(string *)&prop->m_value);
  return;
}

Assistant:

void RecordProperty(const TestProperty& prop)
    {
        for( TestPropertys::iterator it=m_test_propertys.begin()
            , end=m_test_propertys.end(); it != end; ++it )
        {
            if( detail::IsStringEqual(it->key(), prop.key()) )
            {
                it->m_value = prop.m_value;
                return;
            }
        }
        m_test_propertys.push_back(prop);
    }